

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

DBaseDecal * __thiscall
DBaseDecal::CloneSelf
          (DBaseDecal *this,FDecalTemplate *tpl,double ix,double iy,double iz,side_t *wall,
          F3DFloor *ffloor)

{
  FTextureID FVar1;
  DBaseDecal *this_00;
  
  this_00 = (DBaseDecal *)DObject::operator_new(0x98);
  DBaseDecal(this_00,iz);
  FVar1 = StickToWall(this_00,wall,ix,iy,ffloor);
  if (FVar1.texnum < 1) {
    (*(this_00->super_DThinker).super_DObject._vptr_DObject[4])(this_00);
    this_00 = (DBaseDecal *)0x0;
  }
  else {
    FDecalTemplate::ApplyToDecal(tpl,this_00,wall);
    this_00->AlphaColor = this->AlphaColor;
    this_00->RenderFlags = this->RenderFlags & 0xfffff0ff | this_00->RenderFlags & 0xf00;
  }
  return this_00;
}

Assistant:

DBaseDecal *DBaseDecal::CloneSelf (const FDecalTemplate *tpl, double ix, double iy, double iz, side_t *wall, F3DFloor * ffloor) const
{
	DBaseDecal *decal = new DBaseDecal(iz);
	if (decal != NULL)
	{
		if (decal->StickToWall (wall, ix, iy, ffloor).isValid())
		{
			tpl->ApplyToDecal (decal, wall);
			decal->AlphaColor = AlphaColor;
			decal->RenderFlags = (decal->RenderFlags & RF_DECALMASK) |
								 (this->RenderFlags & ~RF_DECALMASK);
		}
		else
		{
			decal->Destroy();
			return NULL;
		}
	}
	return decal;
}